

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

ostream * lambda::operator<<(ostream *os,Parse_error *e)

{
  ostream *poVar1;
  char *pcVar2;
  Parse_error *e_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Parse error: ");
  pcVar2 = (char *)(**(code **)(*(long *)e + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Parse_error const& e) {
  return os << "Parse error: " << e.what();
}